

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O0

void __thiscall
proto2_nofieldpresence_unittest::TestProto2Required::~TestProto2Required(TestProto2Required *this)

{
  TestProto2Required *this_local;
  
  ~TestProto2Required(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestProto2Required::~TestProto2Required() {
  // @@protoc_insertion_point(destructor:proto2_nofieldpresence_unittest.TestProto2Required)
  SharedDtor(*this);
}